

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

Data * Data::minus(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  bool bVar1;
  reference ppDVar2;
  reference ppDVar3;
  long local_48;
  Data *i;
  iterator __end1;
  iterator __begin1;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  Data *result;
  vector<Data_*,_std::allocator<Data_*>_> *dataPara_local;
  
  __range1 = (vector<Data_*,_std::allocator<Data_*>_> *)0x0;
  ppDVar2 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](dataPara,0);
  if (*ppDVar2 == (value_type)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = __dynamic_cast(*ppDVar2,&typeinfo,&Integer::typeinfo,0);
  }
  if (local_48 != 0) {
    __range1 = (vector<Data_*,_std::allocator<Data_*>_> *)Integer::minus(dataPara);
  }
  __end1 = std::vector<Data_*,_std::allocator<Data_*>_>::begin(dataPara);
  i = (Data *)std::vector<Data_*,_std::allocator<Data_*>_>::end(dataPara);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppDVar3 = __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
              operator*(&__end1);
    check(*ppDVar3);
    __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::operator++
              (&__end1);
  }
  if (dataPara != (vector<Data_*,_std::allocator<Data_*>_> *)0x0) {
    std::vector<Data_*,_std::allocator<Data_*>_>::~vector(dataPara);
    operator_delete(dataPara);
  }
  return (Data *)__range1;
}

Assistant:

Data *Data::minus(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0])) != NULL) {
        result = Integer::minus(dataPara);
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}